

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

int __thiscall
CGraphics_Threaded::LoadPNG
          (CGraphics_Threaded *this,CImageInfo *pImg,char *pFilename,int StorageType)

{
  int iVar1;
  undefined4 extraout_var;
  uchar *data;
  undefined4 in_register_0000000c;
  char *fmt;
  long in_FS_OFFSET;
  png_t Png;
  char aCompleteFilename [512];
  png_t local_268;
  undefined1 local_228 [512];
  long local_28;
  IOHANDLE io;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,pFilename,1,CONCAT44(in_register_0000000c,StorageType),
                     local_228,0x200,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar1);
  if (io == (IOHANDLE)0x0) {
    iVar1 = 0;
    dbg_msg("game/png","failed to open file. filename=\'%s\'",pFilename);
    goto LAB_001265aa;
  }
  png_init((png_alloc_t)0x0,(png_free_t)0x0);
  iVar1 = png_open_read(&local_268,(png_read_callback_t)0x0,io);
  if (iVar1 == 0) {
    if (local_268.depth == '\b') {
      if ((local_268.height < 0x2001 && local_268.width < 0x2001) &&
          (local_268.color_type & 0xfb) == 2) {
        data = (uchar *)mem_alloc((uint)local_268.bpp * local_268.height * local_268.width);
        png_get_data(&local_268,data);
        io_close(io);
        pImg->m_Width = local_268.width;
        pImg->m_Height = local_268.height;
        if (local_268.color_type == 2) {
          iVar1 = 0;
LAB_0012661c:
          pImg->m_Format = iVar1;
        }
        else if (local_268.color_type == 6) {
          iVar1 = 1;
          goto LAB_0012661c;
        }
        pImg->m_pData = data;
        iVar1 = 1;
        goto LAB_001265aa;
      }
    }
    fmt = "invalid format. filename=\'%s\'";
  }
  else {
    fmt = "failed to read file. filename=\'%s\'";
  }
  iVar1 = 0;
  dbg_msg("game/png",fmt,local_228);
  io_close(io);
LAB_001265aa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphics_Threaded::LoadPNG(CImageInfo *pImg, const char *pFilename, int StorageType)
{
	// open file for reading
	char aCompleteFilename[IO_MAX_PATH_LENGTH];
	IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, StorageType, aCompleteFilename, sizeof(aCompleteFilename));
	if(!File)
	{
		dbg_msg("game/png", "failed to open file. filename='%s'", pFilename);
		return 0;
	}

	png_init(0, 0); // ignore_convention
	png_t Png; // ignore_convention
	int Error = png_open_read(&Png, 0, File); // ignore_convention
	if(Error != PNG_NO_ERROR)
	{
		dbg_msg("game/png", "failed to read file. filename='%s'", aCompleteFilename);
		io_close(File);
		return 0;
	}

	if(Png.depth != 8 || (Png.color_type != PNG_TRUECOLOR && Png.color_type != PNG_TRUECOLOR_ALPHA) || Png.width > (2<<12) || Png.height > (2<<12)) // ignore_convention
	{
		dbg_msg("game/png", "invalid format. filename='%s'", aCompleteFilename);
		io_close(File);
		return 0;
	}

	unsigned char *pBuffer = (unsigned char *)mem_alloc(Png.width * Png.height * Png.bpp); // ignore_convention
	png_get_data(&Png, pBuffer); // ignore_convention
	io_close(File);

	pImg->m_Width = Png.width; // ignore_convention
	pImg->m_Height = Png.height; // ignore_convention
	if(Png.color_type == PNG_TRUECOLOR) // ignore_convention
		pImg->m_Format = CImageInfo::FORMAT_RGB;
	else if(Png.color_type == PNG_TRUECOLOR_ALPHA) // ignore_convention
		pImg->m_Format = CImageInfo::FORMAT_RGBA;
	pImg->m_pData = pBuffer;
	return 1;
}